

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectile.cpp
# Opt level: O0

void __thiscall
CProjectile::CProjectile
          (CProjectile *this,CGameWorld *pGameWorld,int Type,int Owner,vec2 Pos,vec2 Dir,int Span,
          int Damage,bool Explosive,float Force,int SoundImpact,int Weapon)

{
  vec2 Pos_00;
  int iVar1;
  int iVar2;
  float fVar3;
  CGameContext *pCVar4;
  IServer *this_00;
  CGameWorld *this_01;
  int in_ECX;
  undefined4 in_EDX;
  CEntity *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  undefined8 in_XMM0_Qa;
  float in_XMM1_Da;
  float in_XMM1_Db;
  int in_XMM2_Da;
  byte in_stack_00000008;
  undefined4 in_stack_00000010;
  int in_stack_00000018;
  undefined8 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  CEntity *in_stack_ffffffffffffff70;
  anon_union_4_2_94730284_for_vector2_base<float>_1 in_stack_ffffffffffffff78;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 in_stack_ffffffffffffff7c;
  float local_18;
  float fStack_14;
  vector2_base<float> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = (float)in_XMM0_Qa;
  iVar1 = round_to_int(local_18);
  fStack_14 = (float)((ulong)in_XMM0_Qa >> 0x20);
  iVar2 = round_to_int(fStack_14);
  vector2_base<float>::vector2_base(&local_10,(float)iVar1,(float)iVar2);
  Pos_00.field_1 = in_stack_ffffffffffffff7c;
  Pos_00.field_0 = in_stack_ffffffffffffff78;
  CEntity::CEntity(in_stack_ffffffffffffff70,
                   (CGameWorld *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   (int)((ulong)in_stack_ffffffffffffff60 >> 0x20),Pos_00,
                   (int)in_stack_ffffffffffffff60);
  in_RDI->_vptr_CEntity = (_func_int **)&PTR__CProjectile_00184a68;
  vector2_base<float>::vector2_base((vector2_base<float> *)(in_RDI + 1));
  *(undefined4 *)((long)&in_RDI[1].m_pPrevTypeEntity + 4) = in_EDX;
  iVar1 = round_to_int(in_XMM1_Da * 100.0);
  *(float *)&in_RDI[1]._vptr_CEntity = (float)iVar1 / 100.0;
  iVar1 = round_to_int(in_XMM1_Db * 100.0);
  *(float *)((long)&in_RDI[1]._vptr_CEntity + 4) = (float)iVar1 / 100.0;
  *(undefined4 *)&in_RDI[1].m_pGameWorld = in_R8D;
  *(int *)((long)&in_RDI[1].m_pGameWorld + 4) = in_ECX;
  pCVar4 = CEntity::GameServer((CEntity *)0x11dc5b);
  iVar1 = CPlayer::GetTeam(pCVar4->m_apPlayers[in_ECX]);
  *(int *)&in_RDI[1].m_pPrevTypeEntity = iVar1;
  in_RDI[1].m_ObjType = in_XMM2_Da;
  *(undefined4 *)&in_RDI[1].m_pNextTypeEntity = in_R9D;
  *(undefined4 *)((long)&in_RDI[1].m_pNextTypeEntity + 4) = in_stack_00000010;
  in_RDI[1].m_ID = in_stack_00000018;
  this_00 = CEntity::Server((CEntity *)0x11dcb6);
  fVar3 = (float)IServer::Tick(this_00);
  in_RDI[1].m_ProximityRadius = fVar3;
  in_RDI[1].m_MarkedForDestroy = (bool)(in_stack_00000008 & 1);
  this_01 = CEntity::GameWorld(in_RDI);
  CGameWorld::InsertEntity(this_01,in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CProjectile::CProjectile(CGameWorld *pGameWorld, int Type, int Owner, vec2 Pos, vec2 Dir, int Span,
		int Damage, bool Explosive, float Force, int SoundImpact, int Weapon)
: CEntity(pGameWorld, CGameWorld::ENTTYPE_PROJECTILE, vec2(round_to_int(Pos.x), round_to_int(Pos.y)))
{
	m_Type = Type;
	m_Direction.x = round_to_int(Dir.x*100.0f) / 100.0f;
	m_Direction.y = round_to_int(Dir.y*100.0f) / 100.0f;
	m_LifeSpan = Span;
	m_Owner = Owner;
	m_OwnerTeam = GameServer()->m_apPlayers[Owner]->GetTeam();
	m_Force = Force;
	m_Damage = Damage;
	m_SoundImpact = SoundImpact;
	m_Weapon = Weapon;
	m_StartTick = Server()->Tick();
	m_Explosive = Explosive;

	GameWorld()->InsertEntity(this);
}